

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall
Memory::HeapInfo::Initialize
          (HeapInfo *this,Recycler *recycler,
          _func_void_Recycler_ptr_void_ptr_size_t *trackNativeAllocCallBack,
          PageHeapMode pageheapmode,bool captureAllocCallStack,bool captureFreeCallStack)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 in_XMM3 [16];
  undefined1 auVar5 [16];
  
  Initialize(this,recycler,pageheapmode,captureAllocCallStack,captureFreeCallStack);
  lVar2 = 0xd0;
  do {
    *(_func_void_Recycler_ptr_void_ptr_size_t **)
     ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler + lVar2) =
         trackNativeAllocCallBack;
    auVar1 = _DAT_002d2040;
    lVar2 = lVar2 + 0x380;
  } while (lVar2 != 0xa8d0);
  auVar3 = pmovsxbq(extraout_XMM0,0x100);
  lVar2 = 0;
  auVar5 = pmovsxbq(in_XMM3,0x202);
  do {
    if (SUB168(auVar3 ^ auVar1,0) < -0x7fffffffffffffe3) {
      *(_func_void_Recycler_ptr_void_ptr_size_t **)
       ((long)&this->mediumHeapBuckets[0].heapBucket.
               super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
               .super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
               allocatorHead.pfnTrackNativeAllocatedObjectCallBack + lVar2) =
           trackNativeAllocCallBack;
    }
    if (SUB168(auVar3 ^ auVar1,8) < -0x7fffffffffffffe3) {
      *(_func_void_Recycler_ptr_void_ptr_size_t **)
       ((long)&this->mediumHeapBuckets[1].heapBucket.
               super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
               .super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>.
               allocatorHead.pfnTrackNativeAllocatedObjectCallBack + lVar2) =
           trackNativeAllocCallBack;
    }
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + auVar5._0_8_;
    auVar3._8_8_ = lVar4 + auVar5._8_8_;
    lVar2 = lVar2 + 0x700;
  } while (lVar2 != 0x6900);
  return;
}

Assistant:

void
HeapInfo::Initialize(Recycler * recycler, void(*trackNativeAllocCallBack)(Recycler *, void *, size_t)
#ifdef RECYCLER_PAGE_HEAP
, PageHeapMode pageheapmode
, bool captureAllocCallStack
, bool captureFreeCallStack
#endif
)
{
    Initialize(recycler
#ifdef RECYCLER_PAGE_HEAP
        , pageheapmode
        , captureAllocCallStack
        , captureFreeCallStack
#endif
        );

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].GetBucket<NoBit>().GetAllocator()->SetTrackNativeAllocatedObjectCallBack(trackNativeAllocCallBack);
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].GetBucket<NoBit>().GetAllocator()->SetTrackNativeAllocatedObjectCallBack(trackNativeAllocCallBack);
    }
#endif
}